

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

double __thiscall AngleSet::overlap(AngleSet *this,double sTheta,double eTheta)

{
  double dVar1;
  undefined8 local_28;
  double o;
  double eTheta_local;
  double sTheta_local;
  AngleSet *this_local;
  
  if (eTheta <= sTheta) {
    dVar1 = _overlap(this,sTheta,6.283185307179586);
    local_28 = _overlap(this,0.0,eTheta);
    local_28 = local_28 + dVar1;
  }
  else {
    local_28 = _overlap(this,sTheta,eTheta);
  }
  dVar1 = ArcLength(sTheta,eTheta);
  return local_28 / dVar1;
}

Assistant:

double AngleSet::overlap(double sTheta, double eTheta)
{
	double o;

	if (eTheta > sTheta) {
		o = _overlap(sTheta, eTheta);

	}
	else {
		o = _overlap(sTheta, TWOPI);
		o += _overlap(0, eTheta);
	} //end-else

	return o / ArcLength(sTheta, eTheta);
}